

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall
Assimp::Discreet3DSImporter::InverseNodeSearch
          (Discreet3DSImporter *this,Node *pcNode,Node *pcCurrent)

{
  pointer *pppNVar1;
  iterator iVar2;
  Node *pNVar3;
  Node *local_18;
  
  do {
    pNVar3 = pcCurrent;
    local_18 = pcNode;
    if (pNVar3 == (Node *)0x0) {
      pcCurrent = this->mRootNode;
      goto LAB_003fc864;
    }
    pcCurrent = pNVar3->mParent;
  } while (pNVar3->mHierarchyPos != pcNode->mHierarchyPos);
  if (pcCurrent == (Node *)0x0) {
    iVar2._M_current =
         (pNVar3->mChildren).
         super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pNVar3->mChildren).
        super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>>::
      _M_realloc_insert<Assimp::D3DS::Node*const&>
                ((vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>> *)
                 &pNVar3->mChildren,iVar2,&local_18);
    }
    else {
      *iVar2._M_current = pcNode;
      pppNVar1 = &(pNVar3->mChildren).
                  super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    local_18->mParent = pNVar3;
  }
  else {
LAB_003fc864:
    iVar2._M_current =
         (pcCurrent->mChildren).
         super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pcCurrent->mChildren).
        super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>>::
      _M_realloc_insert<Assimp::D3DS::Node*const&>
                ((vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>> *)
                 &pcCurrent->mChildren,iVar2,&local_18);
    }
    else {
      *iVar2._M_current = pcNode;
      pppNVar1 = &(pcCurrent->mChildren).
                  super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    local_18->mParent = pcCurrent;
  }
  return;
}

Assistant:

void Discreet3DSImporter::InverseNodeSearch(D3DS::Node* pcNode,D3DS::Node* pcCurrent)
{
    if (!pcCurrent) {
        mRootNode->push_back(pcNode);
        return;
    }

    if (pcCurrent->mHierarchyPos == pcNode->mHierarchyPos)  {
        if(pcCurrent->mParent) {
            pcCurrent->mParent->push_back(pcNode);
        }
        else pcCurrent->push_back(pcNode);
        return;
    }
    return InverseNodeSearch(pcNode,pcCurrent->mParent);
}